

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

unsigned_long_long ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  size_t sVar3;
  unsigned_long_long uVar4;
  size_t frameSrcSize;
  unsigned_long_long fcs;
  size_t skippableSize;
  void *pvStack_28;
  U32 magicNumber;
  unsigned_long_long totalDstSize;
  size_t srcSize_local;
  void *src_local;
  
  pvStack_28 = (void *)0x0;
  totalDstSize = srcSize;
  srcSize_local = (size_t)src;
  while( true ) {
    while( true ) {
      sVar3 = ZSTD_startingInputLength(ZSTD_f_zstd1);
      if (totalDstSize < sVar3) {
        if (totalDstSize == 0) {
          src_local = pvStack_28;
        }
        else {
          src_local = (void *)0xfffffffffffffffe;
        }
        return (unsigned_long_long)src_local;
      }
      UVar1 = MEM_readLE32((void *)srcSize_local);
      if ((UVar1 & 0xfffffff0) != 0x184d2a50) break;
      sVar3 = readSkippableFrameSize((void *)srcSize_local,totalDstSize);
      uVar2 = ERR_isError(sVar3);
      if (uVar2 != 0) {
        return 0xfffffffffffffffe;
      }
      if (totalDstSize < sVar3) {
        __assert_fail("skippableSize <= srcSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x288,"unsigned long long ZSTD_findDecompressedSize(const void *, size_t)");
      }
      srcSize_local = srcSize_local + sVar3;
      totalDstSize = totalDstSize - sVar3;
    }
    uVar4 = ZSTD_getFrameContentSize((void *)srcSize_local,totalDstSize);
    if (0xfffffffffffffffd < uVar4) {
      return uVar4;
    }
    if ((void *)((long)pvStack_28 + uVar4) < pvStack_28) {
      return 0xfffffffffffffffe;
    }
    pvStack_28 = (void *)(uVar4 + (long)pvStack_28);
    sVar3 = ZSTD_findFrameCompressedSize((void *)srcSize_local,totalDstSize);
    uVar2 = ERR_isError(sVar3);
    if (uVar2 != 0) {
      return 0xfffffffffffffffe;
    }
    if (totalDstSize < sVar3) break;
    srcSize_local = srcSize_local + sVar3;
    totalDstSize = totalDstSize - sVar3;
  }
  __assert_fail("frameSrcSize <= srcSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                ,0x299,"unsigned long long ZSTD_findDecompressedSize(const void *, size_t)");
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_startingInputLength(ZSTD_f_zstd1)) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t const skippableSize = readSkippableFrameSize(src, srcSize);
            if (ZSTD_isError(skippableSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(skippableSize <= srcSize);

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const fcs = ZSTD_getFrameContentSize(src, srcSize);
            if (fcs >= ZSTD_CONTENTSIZE_ERROR) return fcs;

            if (totalDstSize + fcs < totalDstSize)
                return ZSTD_CONTENTSIZE_ERROR; /* check for overflow */
            totalDstSize += fcs;
        }
        /* skip to next frame */
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(frameSrcSize <= srcSize);

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}